

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Functional::BufferMapTests::init(BufferMapTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 dVar2;
  VerifyType VVar3;
  Context *pCVar4;
  TestNode *pTVar5;
  BufferMapReadCase *pBVar6;
  char *pcVar7;
  TestNode *pTVar8;
  BufferMapWriteCase *pBVar9;
  BufferPartialMapWriteCase *this_00;
  BufferMapInvalidateCase *pBVar10;
  BufferMapPartialInvalidateCase *pBVar11;
  BufferMapExplicitFlushCase *pBVar12;
  BufferMapUnsyncWriteCase *this_01;
  BufferMapReadWriteCase *pBVar13;
  ulong extraout_RAX;
  ulong uVar14;
  allocator<char> local_6d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  undefined1 local_690 [8];
  string name_4;
  int size_5;
  deUint32 hint_9;
  deUint32 target_9;
  int hintNdx_2;
  int targetNdx_9;
  TestCaseGroup *hintsGroup_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  undefined1 local_602;
  allocator<char> local_601;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  allocator<char> local_5b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  undefined1 local_578 [8];
  string name_3;
  int partialSize_2;
  int partialOffs_2;
  int size_4;
  deUint32 hint_8;
  deUint32 target_8;
  int targetNdx_8;
  TestCaseGroup *useGroup_1;
  VerifyType verify_1;
  int useNdx_1;
  TestCaseGroup *mapReadWriteGroup;
  deUint32 hint_7;
  deUint32 target_7;
  int targetNdx_7;
  TestCaseGroup *unsyncGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  undefined1 local_4c2;
  allocator<char> local_4c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  deUint32 local_47c;
  deUint32 local_478;
  deUint32 hint_6;
  deUint32 target_6;
  int targetNdx_6;
  TestCaseGroup *flushGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  undefined1 local_41a;
  allocator<char> local_419;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  deUint32 local_3d4;
  deUint32 local_3d0;
  deUint32 hint_5;
  deUint32 target_5;
  int targetNdx_5;
  TestCaseGroup *invalidateGroup_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  undefined1 local_372;
  allocator<char> local_371;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  deUint32 local_32c;
  deUint32 local_328;
  deUint32 hint_4;
  deUint32 target_4;
  int targetNdx_4;
  TestCaseGroup *invalidateGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined1 local_2d0 [8];
  string name_2;
  int size_3;
  deUint32 hint_3;
  deUint32 target_3;
  int hintNdx_1;
  int targetNdx_3;
  TestCaseGroup *hintsGroup_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_242;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [8];
  string name_1;
  int partialSize_1;
  int partialOffs_1;
  int size_2;
  deUint32 hint_2;
  deUint32 target_2;
  int targetNdx_2;
  TestCaseGroup *useGroup;
  VerifyType verify;
  int useNdx;
  TestCaseGroup *mapWriteGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string name;
  int size_1;
  deUint32 hint_1;
  deUint32 target_1;
  int hintNdx;
  int targetNdx_1;
  TestCaseGroup *hintsGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_92;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined4 local_50;
  undefined4 local_4c;
  int partialSize;
  int partialOffs;
  int size;
  deUint32 hint;
  deUint32 target;
  int targetNdx;
  TestCaseGroup *writeGroup;
  int local_28;
  WriteType write;
  int srcNdx;
  TestNode *local_18;
  TestCaseGroup *mapReadGroup;
  BufferMapTests *this_local;
  
  mapReadGroup = (TestCaseGroup *)this;
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"read",
             "Buffer read using glMapBufferRange()");
  local_18 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
    writeGroup._4_4_ = init::bufferDataSources[local_28].write;
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferDataSources[local_28].name,"");
    _target = pTVar5;
    tcu::TestNode::addChild(local_18,pTVar5);
    for (hint = 0; pTVar5 = _target, (int)hint < 8; hint = hint + 1) {
      size = init::bufferTargets[(int)hint];
      partialOffs = 0x88e5;
      partialSize = 0x3fb;
      local_4c = 0x11;
      local_50 = 0x1f5;
      pBVar6 = (BufferMapReadCase *)operator_new(0xd8);
      local_92 = 1;
      pCVar4 = (this->super_TestCaseGroup).m_context;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(size);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar7,&local_91);
      std::operator+(&local_70,&local_90,"_full");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      BufferMapReadCase::BufferMapReadCase
                (pBVar6,pCVar4,pcVar7,"",size,0x88e5,0x3fb,0,0x3fb,writeGroup._4_4_);
      local_92 = 0;
      tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      pTVar5 = _target;
      pBVar6 = (BufferMapReadCase *)operator_new(0xd8);
      hintsGroup._6_1_ = 1;
      pCVar4 = (this->super_TestCaseGroup).m_context;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(size);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,pcVar7,(allocator<char> *)((long)&hintsGroup + 7));
      std::operator+(&local_b8,&local_d8,"_partial");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      BufferMapReadCase::BufferMapReadCase
                (pBVar6,pCVar4,pcVar7,"",size,0x88e5,0x3fb,0x11,0x1f5,writeGroup._4_4_);
      hintsGroup._6_1_ = 0;
      tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&hintsGroup + 7));
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"usage_hints",
             "Different usage hints with glMapBufferRange()");
  tcu::TestNode::addChild(local_18,pTVar5);
  for (target_1 = 0; (int)target_1 < 8; target_1 = target_1 + 1) {
    for (hint_1 = 0; (int)hint_1 < 9; hint_1 = hint_1 + 1) {
      dVar1 = init::bufferTargets[(int)target_1];
      dVar2 = init::usageHints[(int)hint_1];
      name.field_2._12_4_ = 0x3fb;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,pcVar7,(allocator<char> *)((long)&mapWriteGroup + 7));
      std::operator+(&local_140,&local_160,"_");
      pcVar7 = deqp::gls::BufferTestUtil::getUsageHintName(dVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     &local_140,pcVar7);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator((allocator<char> *)((long)&mapWriteGroup + 7));
      pBVar6 = (BufferMapReadCase *)operator_new(0xd8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      pcVar7 = (char *)std::__cxx11::string::c_str();
      BufferMapReadCase::BufferMapReadCase
                (pBVar6,pCVar4,pcVar7,"",dVar1,dVar2,0x3fb,0,0x3fb,WRITE_BUFFER_SUB_DATA);
      tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
      std::__cxx11::string::~string((string *)local_120);
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"write",
             "Buffer write using glMapBufferRange()");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (useGroup._4_4_ = 0; useGroup._4_4_ < 3; useGroup._4_4_ = useGroup._4_4_ + 1) {
    VVar3 = init::bufferUses[useGroup._4_4_].verify;
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferUses[useGroup._4_4_].name,"");
    tcu::TestNode::addChild(pTVar5,pTVar8);
    for (hint_2 = 0; (int)hint_2 < 8; hint_2 = hint_2 + 1) {
      dVar1 = init::bufferTargets[(int)hint_2];
      name_1.field_2._12_4_ = 0x11;
      name_1.field_2._8_4_ = 0x1f5;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,pcVar7,&local_1f9);
      std::operator+(&local_1d8,&local_1f8,"_");
      pcVar7 = deqp::gls::BufferTestUtil::getUsageHintName(0x88e4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     &local_1d8,pcVar7);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      pBVar9 = (BufferMapWriteCase *)operator_new(0xd0);
      local_242 = 1;
      pCVar4 = (this->super_TestCaseGroup).m_context;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,pcVar7,&local_241);
      std::operator+(&local_220,&local_240,"_full");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      BufferMapWriteCase::BufferMapWriteCase(pBVar9,pCVar4,pcVar7,"",dVar1,0x88e4,0x3fb,VVar3);
      local_242 = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar9);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator(&local_241);
      this_00 = (BufferPartialMapWriteCase *)operator_new(0xd8);
      hintsGroup_1._6_1_ = 1;
      pCVar4 = (this->super_TestCaseGroup).m_context;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_288,pcVar7,(allocator<char> *)((long)&hintsGroup_1 + 7));
      std::operator+(&local_268,&local_288,"_partial");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      BufferPartialMapWriteCase::BufferPartialMapWriteCase
                (this_00,pCVar4,pcVar7,"",dVar1,0x88e4,0x3fb,0x11,0x1f5,VVar3);
      hintsGroup_1._6_1_ = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator((allocator<char> *)((long)&hintsGroup_1 + 7));
      std::__cxx11::string::~string((string *)local_1b8);
    }
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"usage_hints",
             "Usage hints");
  tcu::TestNode::addChild(pTVar5,pTVar8);
  for (target_3 = 0; (int)target_3 < 8; target_3 = target_3 + 1) {
    for (hint_3 = 0; (int)hint_3 < 9; hint_3 = hint_3 + 1) {
      dVar1 = init::bufferTargets[(int)target_3];
      dVar2 = init::usageHints[(int)hint_3];
      name_2.field_2._12_4_ = 0x3fb;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,pcVar7,(allocator<char> *)((long)&invalidateGroup + 7));
      std::operator+(&local_2f0,&local_310,"_");
      pcVar7 = deqp::gls::BufferTestUtil::getUsageHintName(dVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                     &local_2f0,pcVar7);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator((allocator<char> *)((long)&invalidateGroup + 7));
      pBVar9 = (BufferMapWriteCase *)operator_new(0xd0);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      pcVar7 = (char *)std::__cxx11::string::c_str();
      BufferMapWriteCase::BufferMapWriteCase
                (pBVar9,pCVar4,pcVar7,"",dVar1,dVar2,0x3fb,VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar9);
      std::__cxx11::string::~string((string *)local_2d0);
    }
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"invalidate",
             "Buffer invalidate");
  _target_4 = pTVar8;
  tcu::TestNode::addChild(pTVar5,pTVar8);
  for (hint_4 = 0; pTVar8 = _target_4, (int)hint_4 < 8; hint_4 = hint_4 + 1) {
    local_328 = init::bufferTargets[(int)hint_4];
    local_32c = 0x88e4;
    pBVar10 = (BufferMapInvalidateCase *)operator_new(0xd0);
    local_372 = 1;
    pCVar4 = (this->super_TestCaseGroup).m_context;
    pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(local_328);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,pcVar7,&local_371);
    std::operator+(&local_350,&local_370,"_write_all");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    BufferMapInvalidateCase::BufferMapInvalidateCase
              (pBVar10,pCVar4,pcVar7,"",local_328,local_32c,false,VERIFY_AS_VERTEX_ARRAY);
    local_372 = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar10);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
    pTVar8 = _target_4;
    pBVar10 = (BufferMapInvalidateCase *)operator_new(0xd0);
    invalidateGroup_1._6_1_ = 1;
    pCVar4 = (this->super_TestCaseGroup).m_context;
    pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(local_328);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,pcVar7,(allocator<char> *)((long)&invalidateGroup_1 + 7));
    std::operator+(&local_398,&local_3b8,"_write_partial");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    BufferMapInvalidateCase::BufferMapInvalidateCase
              (pBVar10,pCVar4,pcVar7,"",local_328,local_32c,true,VERIFY_AS_VERTEX_ARRAY);
    invalidateGroup_1._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar10);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&invalidateGroup_1 + 7));
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "partial_invalidate","Partial invalidate");
  _target_5 = pTVar8;
  tcu::TestNode::addChild(pTVar5,pTVar8);
  for (hint_5 = 0; pTVar8 = _target_5, (int)hint_5 < 8; hint_5 = hint_5 + 1) {
    local_3d0 = init::bufferTargets[(int)hint_5];
    local_3d4 = 0x88e4;
    pBVar11 = (BufferMapPartialInvalidateCase *)operator_new(0xd0);
    local_41a = 1;
    pCVar4 = (this->super_TestCaseGroup).m_context;
    pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(local_3d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,pcVar7,&local_419);
    std::operator+(&local_3f8,&local_418,"_write_all");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    BufferMapPartialInvalidateCase::BufferMapPartialInvalidateCase
              (pBVar11,pCVar4,pcVar7,"",local_3d0,local_3d4,false,VERIFY_AS_VERTEX_ARRAY);
    local_41a = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar11);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator(&local_419);
    pTVar8 = _target_5;
    pBVar11 = (BufferMapPartialInvalidateCase *)operator_new(0xd0);
    flushGroup._6_1_ = 1;
    pCVar4 = (this->super_TestCaseGroup).m_context;
    pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(local_3d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,pcVar7,(allocator<char> *)((long)&flushGroup + 7));
    std::operator+(&local_440,&local_460,"_write_partial");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    BufferMapPartialInvalidateCase::BufferMapPartialInvalidateCase
              (pBVar11,pCVar4,pcVar7,"",local_3d0,local_3d4,true,VERIFY_AS_VERTEX_ARRAY);
    flushGroup._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar11);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator((allocator<char> *)((long)&flushGroup + 7));
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "explicit_flush","Explicit flush");
  _target_6 = pTVar8;
  tcu::TestNode::addChild(pTVar5,pTVar8);
  for (hint_6 = 0; pTVar8 = _target_6, (int)hint_6 < 8; hint_6 = hint_6 + 1) {
    local_478 = init::bufferTargets[(int)hint_6];
    local_47c = 0x88e4;
    pBVar12 = (BufferMapExplicitFlushCase *)operator_new(0xd0);
    local_4c2 = 1;
    pCVar4 = (this->super_TestCaseGroup).m_context;
    pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(local_478);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,pcVar7,&local_4c1);
    std::operator+(&local_4a0,&local_4c0,"_all");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    BufferMapExplicitFlushCase::BufferMapExplicitFlushCase
              (pBVar12,pCVar4,pcVar7,"",local_478,local_47c,false,VERIFY_AS_VERTEX_ARRAY);
    local_4c2 = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar12);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4c1);
    pTVar8 = _target_6;
    pBVar12 = (BufferMapExplicitFlushCase *)operator_new(0xd0);
    unsyncGroup._6_1_ = 1;
    pCVar4 = (this->super_TestCaseGroup).m_context;
    pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(local_478);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_508,pcVar7,(allocator<char> *)((long)&unsyncGroup + 7));
    std::operator+(&local_4e8,&local_508,"_partial");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    BufferMapExplicitFlushCase::BufferMapExplicitFlushCase
              (pBVar12,pCVar4,pcVar7,"",local_478,local_47c,true,VERIFY_AS_VERTEX_ARRAY);
    unsyncGroup._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar12);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator((allocator<char> *)((long)&unsyncGroup + 7));
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unsynchronized","Unsynchronized map");
  tcu::TestNode::addChild(pTVar5,pTVar8);
  for (hint_7 = 0; (int)hint_7 < 8; hint_7 = hint_7 + 1) {
    dVar1 = init::bufferTargets[(int)hint_7];
    this_01 = (BufferMapUnsyncWriteCase *)operator_new(200);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
    BufferMapUnsyncWriteCase::BufferMapUnsyncWriteCase(this_01,pCVar4,pcVar7,"",dVar1,0x88e4);
    tcu::TestNode::addChild(pTVar8,(TestNode *)this_01);
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"read_write",
             "Buffer read and write using glMapBufferRange()");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (useGroup_1._4_4_ = 0; useGroup_1._4_4_ < 3; useGroup_1._4_4_ = useGroup_1._4_4_ + 1) {
    VVar3 = init::bufferUses[useGroup_1._4_4_].verify;
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferUses[useGroup_1._4_4_].name,"");
    tcu::TestNode::addChild(pTVar5,pTVar8);
    for (hint_8 = 0; (int)hint_8 < 8; hint_8 = hint_8 + 1) {
      dVar1 = init::bufferTargets[(int)hint_8];
      name_3.field_2._12_4_ = 0x11;
      name_3.field_2._8_4_ = 0x1f5;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,pcVar7,&local_5b9);
      std::operator+(&local_598,&local_5b8,"_");
      pcVar7 = deqp::gls::BufferTestUtil::getUsageHintName(0x88e4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578,
                     &local_598,pcVar7);
      std::__cxx11::string::~string((string *)&local_598);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::allocator<char>::~allocator(&local_5b9);
      pBVar13 = (BufferMapReadWriteCase *)operator_new(0xd8);
      local_602 = 1;
      pCVar4 = (this->super_TestCaseGroup).m_context;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,pcVar7,&local_601);
      std::operator+(&local_5e0,&local_600,"_full");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      BufferMapReadWriteCase::BufferMapReadWriteCase
                (pBVar13,pCVar4,pcVar7,"",dVar1,0x88e4,0x3fb,0,0x3fb,VVar3);
      local_602 = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar13);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_600);
      std::allocator<char>::~allocator(&local_601);
      pBVar13 = (BufferMapReadWriteCase *)operator_new(0xd8);
      hintsGroup_2._6_1_ = 1;
      pCVar4 = (this->super_TestCaseGroup).m_context;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_648,pcVar7,(allocator<char> *)((long)&hintsGroup_2 + 7));
      std::operator+(&local_628,&local_648,"_partial");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      BufferMapReadWriteCase::BufferMapReadWriteCase
                (pBVar13,pCVar4,pcVar7,"",dVar1,0x88e4,0x3fb,0x11,0x1f5,VVar3);
      hintsGroup_2._6_1_ = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar13);
      std::__cxx11::string::~string((string *)&local_628);
      std::__cxx11::string::~string((string *)&local_648);
      std::allocator<char>::~allocator((allocator<char> *)((long)&hintsGroup_2 + 7));
      std::__cxx11::string::~string((string *)local_578);
    }
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"usage_hints",
             "Usage hints");
  tcu::TestNode::addChild(pTVar5,pTVar8);
  target_9 = 0;
  uVar14 = extraout_RAX;
  while ((int)target_9 < 8) {
    for (hint_9 = 0; (int)hint_9 < 9; hint_9 = hint_9 + 1) {
      dVar1 = init::bufferTargets[(int)target_9];
      dVar2 = init::usageHints[(int)hint_9];
      name_4.field_2._12_4_ = 0x3fb;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,pcVar7,&local_6d1);
      std::operator+(&local_6b0,&local_6d0,"_");
      pcVar7 = deqp::gls::BufferTestUtil::getUsageHintName(dVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_690,
                     &local_6b0,pcVar7);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::allocator<char>::~allocator(&local_6d1);
      pBVar13 = (BufferMapReadWriteCase *)operator_new(0xd8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      pcVar7 = (char *)std::__cxx11::string::c_str();
      BufferMapReadWriteCase::BufferMapReadWriteCase
                (pBVar13,pCVar4,pcVar7,"",dVar1,dVar2,0x3fb,0,0x3fb,VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar13);
      std::__cxx11::string::~string((string *)local_690);
    }
    target_9 = target_9 + 1;
    uVar14 = (ulong)target_9;
  }
  return (int)uVar14;
}

Assistant:

void BufferMapTests::init (void)
{
	static const deUint32 bufferTargets[] =
	{
		GL_ARRAY_BUFFER,
		GL_COPY_READ_BUFFER,
		GL_COPY_WRITE_BUFFER,
		GL_ELEMENT_ARRAY_BUFFER,
		GL_PIXEL_PACK_BUFFER,
		GL_PIXEL_UNPACK_BUFFER,
		GL_TRANSFORM_FEEDBACK_BUFFER,
		GL_UNIFORM_BUFFER
	};

	static const deUint32 usageHints[] =
	{
		GL_STREAM_DRAW,
		GL_STREAM_READ,
		GL_STREAM_COPY,
		GL_STATIC_DRAW,
		GL_STATIC_READ,
		GL_STATIC_COPY,
		GL_DYNAMIC_DRAW,
		GL_DYNAMIC_READ,
		GL_DYNAMIC_COPY
	};

	static const struct
	{
		const char*		name;
		WriteType		write;
	} bufferDataSources[] =
	{
		{ "sub_data",		WRITE_BUFFER_SUB_DATA	},
		{ "map_write",		WRITE_BUFFER_WRITE_MAP	}
	};

	static const struct
	{
		const char*		name;
		VerifyType		verify;
	} bufferUses[] =
	{
		{ "map_read",				VERIFY_BUFFER_READ_MAP	},
		{ "render_as_vertex_array",	VERIFY_AS_VERTEX_ARRAY	},
		{ "render_as_index_array",	VERIFY_AS_INDEX_ARRAY	}
	};

	// .read
	{
		tcu::TestCaseGroup* mapReadGroup = new tcu::TestCaseGroup(m_testCtx, "read", "Buffer read using glMapBufferRange()");
		addChild(mapReadGroup);

		// .[data src]
		for (int srcNdx = 0; srcNdx < DE_LENGTH_OF_ARRAY(bufferDataSources); srcNdx++)
		{
			WriteType			write		= bufferDataSources[srcNdx].write;
			tcu::TestCaseGroup* writeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferDataSources[srcNdx].name, "");
			mapReadGroup->addChild(writeGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				const deUint32	hint		= GL_STATIC_READ;
				const int		size		= 1019;
				const int		partialOffs	= 17;
				const int		partialSize	= 501;

				writeGroup->addChild(new BufferMapReadCase(m_context, (string(getBufferTargetName(target)) + "_full").c_str(),		"", target, hint, size, 0, size, write));
				writeGroup->addChild(new BufferMapReadCase(m_context, (string(getBufferTargetName(target)) + "_partial").c_str(),	"", target, hint, size, partialOffs, partialSize, write));
			}
		}

		// .usage_hints
		{
			tcu::TestCaseGroup* hintsGroup = new tcu::TestCaseGroup(m_testCtx, "usage_hints", "Different usage hints with glMapBufferRange()");
			mapReadGroup->addChild(hintsGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				for (int hintNdx = 0; hintNdx < DE_LENGTH_OF_ARRAY(usageHints); hintNdx++)
				{
					deUint32		target		= bufferTargets[targetNdx];
					deUint32		hint		= usageHints[hintNdx];
					const int		size		= 1019;
					string			name		= string(getBufferTargetName(target)) + "_" + getUsageHintName(hint);

					hintsGroup->addChild(new BufferMapReadCase(m_context, name.c_str(), "", target, hint, size, 0, size, WRITE_BUFFER_SUB_DATA));
				}
			}
		}
	}

	// .write
	{
		tcu::TestCaseGroup* mapWriteGroup = new tcu::TestCaseGroup(m_testCtx, "write", "Buffer write using glMapBufferRange()");
		addChild(mapWriteGroup);

		// .[verify type]
		for (int useNdx = 0; useNdx < DE_LENGTH_OF_ARRAY(bufferUses); useNdx++)
		{
			VerifyType			verify		= bufferUses[useNdx].verify;
			tcu::TestCaseGroup* useGroup	= new tcu::TestCaseGroup(m_testCtx, bufferUses[useNdx].name, "");
			mapWriteGroup->addChild(useGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;
				const int		size		= 1019;
				const int		partialOffs	= 17;
				const int		partialSize	= 501;
				string			name		= string(getBufferTargetName(target)) + "_" + getUsageHintName(hint);

				useGroup->addChild(new BufferMapWriteCase			(m_context, (string(getBufferTargetName(target)) + "_full").c_str(),	"", target, hint, size, verify));
				useGroup->addChild(new BufferPartialMapWriteCase	(m_context, (string(getBufferTargetName(target)) + "_partial").c_str(),	"", target, hint, size, partialOffs, partialSize, verify));
			}
		}

		// .usage_hints
		{
			tcu::TestCaseGroup* hintsGroup = new tcu::TestCaseGroup(m_testCtx, "usage_hints", "Usage hints");
			mapWriteGroup->addChild(hintsGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				for (int hintNdx = 0; hintNdx < DE_LENGTH_OF_ARRAY(usageHints); hintNdx++)
				{
					deUint32		target		= bufferTargets[targetNdx];
					deUint32		hint		= usageHints[hintNdx];
					const int		size		= 1019;
					string			name		= string(getBufferTargetName(target)) + "_" + getUsageHintName(hint);

					hintsGroup->addChild(new BufferMapWriteCase(m_context, name.c_str(), "", target, hint, size, VERIFY_AS_VERTEX_ARRAY));
				}
			}
		}

		// .invalidate
		{
			tcu::TestCaseGroup* invalidateGroup = new tcu::TestCaseGroup(m_testCtx, "invalidate", "Buffer invalidate");
			mapWriteGroup->addChild(invalidateGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;

				invalidateGroup->addChild(new BufferMapInvalidateCase(m_context, (string(getBufferTargetName(target)) + "_write_all").c_str(),		"", target, hint, false,	VERIFY_AS_VERTEX_ARRAY));
				invalidateGroup->addChild(new BufferMapInvalidateCase(m_context, (string(getBufferTargetName(target)) + "_write_partial").c_str(),	"", target, hint, true,		VERIFY_AS_VERTEX_ARRAY));
			}
		}

		// .partial_invalidate
		{
			tcu::TestCaseGroup* invalidateGroup = new tcu::TestCaseGroup(m_testCtx, "partial_invalidate", "Partial invalidate");
			mapWriteGroup->addChild(invalidateGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;

				invalidateGroup->addChild(new BufferMapPartialInvalidateCase(m_context, (string(getBufferTargetName(target)) + "_write_all").c_str(),		"", target, hint, false,	VERIFY_AS_VERTEX_ARRAY));
				invalidateGroup->addChild(new BufferMapPartialInvalidateCase(m_context, (string(getBufferTargetName(target)) + "_write_partial").c_str(),	"", target, hint, true,		VERIFY_AS_VERTEX_ARRAY));
			}
		}

		// .explicit_flush
		{
			tcu::TestCaseGroup* flushGroup = new tcu::TestCaseGroup(m_testCtx, "explicit_flush", "Explicit flush");
			mapWriteGroup->addChild(flushGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;

				flushGroup->addChild(new BufferMapExplicitFlushCase(m_context, (string(getBufferTargetName(target)) + "_all").c_str(),		"", target, hint, false,	VERIFY_AS_VERTEX_ARRAY));
				flushGroup->addChild(new BufferMapExplicitFlushCase(m_context, (string(getBufferTargetName(target)) + "_partial").c_str(),	"", target, hint, true,		VERIFY_AS_VERTEX_ARRAY));
			}
		}

		// .unsynchronized
		{
			tcu::TestCaseGroup* unsyncGroup = new tcu::TestCaseGroup(m_testCtx, "unsynchronized", "Unsynchronized map");
			mapWriteGroup->addChild(unsyncGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;

				unsyncGroup->addChild(new BufferMapUnsyncWriteCase(m_context, getBufferTargetName(target),	"", target, hint));
			}
		}
	}

	// .read_write
	{
		tcu::TestCaseGroup* mapReadWriteGroup = new tcu::TestCaseGroup(m_testCtx, "read_write", "Buffer read and write using glMapBufferRange()");
		addChild(mapReadWriteGroup);

		// .[verify type]
		for (int useNdx = 0; useNdx < DE_LENGTH_OF_ARRAY(bufferUses); useNdx++)
		{
			VerifyType			verify		= bufferUses[useNdx].verify;
			tcu::TestCaseGroup* useGroup	= new tcu::TestCaseGroup(m_testCtx, bufferUses[useNdx].name, "");
			mapReadWriteGroup->addChild(useGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;
				const int		size		= 1019;
				const int		partialOffs	= 17;
				const int		partialSize	= 501;
				string			name		= string(getBufferTargetName(target)) + "_" + getUsageHintName(hint);

				useGroup->addChild(new BufferMapReadWriteCase(m_context, (string(getBufferTargetName(target)) + "_full").c_str(),		"", target, hint, size, 0, size, verify));
				useGroup->addChild(new BufferMapReadWriteCase(m_context, (string(getBufferTargetName(target)) + "_partial").c_str(),	"", target, hint, size, partialOffs, partialSize, verify));
			}
		}

		// .usage_hints
		{
			tcu::TestCaseGroup* hintsGroup = new tcu::TestCaseGroup(m_testCtx, "usage_hints", "Usage hints");
			mapReadWriteGroup->addChild(hintsGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				for (int hintNdx = 0; hintNdx < DE_LENGTH_OF_ARRAY(usageHints); hintNdx++)
				{
					deUint32		target		= bufferTargets[targetNdx];
					deUint32		hint		= usageHints[hintNdx];
					const int		size		= 1019;
					string			name		= string(getBufferTargetName(target)) + "_" + getUsageHintName(hint);

					hintsGroup->addChild(new BufferMapReadWriteCase(m_context, name.c_str(), "", target, hint, size, 0, size, VERIFY_AS_VERTEX_ARRAY));
				}
			}
		}
	}
}